

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  bool bVar1;
  OfType OVar2;
  Column *value;
  ReusableStringStream *pRVar3;
  StringRef name;
  string local_1d8;
  StringRef local_1b8;
  SourceLineInfo local_1a8;
  char local_191;
  reference local_190;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  StringRef local_168;
  char local_151;
  string local_150;
  Column local_130;
  char local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  ReusableStringStream rss;
  string local_a0;
  StringRef local_80;
  StringRef local_70;
  undefined1 local_60 [8];
  ScopedElement e;
  string local_40 [8];
  string elementName;
  AssertionResult *result;
  AssertionStats *stats_local;
  JunitReporter *this_local;
  
  elementName.field_2._8_8_ = stats;
  bVar1 = AssertionResult::isOk(&stats->assertionResult);
  if ((bVar1) &&
     (OVar2 = AssertionResult::getResultType((AssertionResult *)elementName.field_2._8_8_),
     OVar2 != ExplicitSkip)) {
    return;
  }
  std::__cxx11::string::string(local_40);
  OVar2 = AssertionResult::getResultType((AssertionResult *)elementName.field_2._8_8_);
  if (3 < (uint)(OVar2 + Info)) {
    if (OVar2 == ExplicitSkip) {
      std::__cxx11::string::operator=(local_40,"skipped");
      goto LAB_0014ecbf;
    }
    if (OVar2 != FailureBit) {
      if ((uint)(OVar2 + ~FailureBit) < 2) {
LAB_0014ec83:
        std::__cxx11::string::operator=(local_40,"failure");
        goto LAB_0014ecbf;
      }
      if (OVar2 != Exception) {
        if (OVar2 != ThrewException) {
          if (OVar2 == DidntThrowException) goto LAB_0014ec83;
          if (OVar2 != FatalErrorCondition) goto LAB_0014ecbf;
        }
        std::__cxx11::string::operator=(local_40,"error");
        goto LAB_0014ecbf;
      }
    }
  }
  std::__cxx11::string::operator=(local_40,"internalError");
LAB_0014ecbf:
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_60,(string *)&this->xml,(XmlFormatting)local_40);
  local_70 = operator____sr("message",7);
  AssertionResult::getExpression_abi_cxx11_(&local_a0,(AssertionResult *)elementName.field_2._8_8_);
  StringRef::StringRef(&local_80,&local_a0);
  XmlWriter::writeAttribute(&this->xml,local_70,local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  name = operator____sr("type",4);
  join_0x00000010_0x00000000_ =
       AssertionResult::getTestMacroName((AssertionResult *)elementName.field_2._8_8_);
  XmlWriter::writeAttribute(&this->xml,name,join_0x00000010_0x00000000_);
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_d0);
  OVar2 = AssertionResult::getResultType((AssertionResult *)elementName.field_2._8_8_);
  if (OVar2 == ExplicitSkip) {
    ReusableStringStream::operator<<((ReusableStringStream *)local_d0,(char (*) [9])"SKIPPED\n");
  }
  else {
    pRVar3 = ReusableStringStream::operator<<
                       ((ReusableStringStream *)local_d0,(char (*) [7])"FAILED");
    ReusableStringStream::operator<<(pRVar3,(char (*) [3])0x2fe88f);
    bVar1 = AssertionResult::hasExpression((AssertionResult *)elementName.field_2._8_8_);
    if (bVar1) {
      ReusableStringStream::operator<<((ReusableStringStream *)local_d0,(char (*) [3])0x2fe9e3);
      AssertionResult::getExpressionInMacro_abi_cxx11_
                (&local_f0,(AssertionResult *)elementName.field_2._8_8_);
      ReusableStringStream::operator<<((ReusableStringStream *)local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      local_f1 = '\n';
      ReusableStringStream::operator<<((ReusableStringStream *)local_d0,&local_f1);
    }
    bVar1 = AssertionResult::hasExpandedExpression((AssertionResult *)elementName.field_2._8_8_);
    if (bVar1) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)local_d0,(char (*) [17])"with expansion:\n");
      AssertionResult::getExpandedExpression_abi_cxx11_
                (&local_150,(AssertionResult *)elementName.field_2._8_8_);
      TextFlow::Column::Column(&local_130,&local_150);
      value = TextFlow::Column::indent(&local_130,2);
      pRVar3 = ReusableStringStream::operator<<((ReusableStringStream *)local_d0,value);
      local_151 = '\n';
      ReusableStringStream::operator<<(pRVar3,&local_151);
      TextFlow::Column::~Column(&local_130);
      std::__cxx11::string::~string((string *)&local_150);
    }
  }
  bVar1 = AssertionResult::hasMessage((AssertionResult *)elementName.field_2._8_8_);
  if (bVar1) {
    local_168 = AssertionResult::getMessage((AssertionResult *)elementName.field_2._8_8_);
    pRVar3 = ReusableStringStream::operator<<((ReusableStringStream *)local_d0,&local_168);
    __range2._7_1_ = 10;
    ReusableStringStream::operator<<(pRVar3,(char *)((long)&__range2 + 7));
  }
  __end2 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                     (&stats->infoMessages);
  msg = (MessageInfo *)
        std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                  (&stats->infoMessages);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                     *)&msg), bVar1) {
    local_190 = __gnu_cxx::
                __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                ::operator*(&__end2);
    if (local_190->type == Info) {
      pRVar3 = ReusableStringStream::operator<<
                         ((ReusableStringStream *)local_d0,&local_190->message);
      local_191 = '\n';
      ReusableStringStream::operator<<(pRVar3,&local_191);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&__end2);
  }
  pRVar3 = ReusableStringStream::operator<<((ReusableStringStream *)local_d0,(char (*) [4])0x2fc925)
  ;
  local_1a8 = AssertionResult::getSourceInfo((AssertionResult *)elementName.field_2._8_8_);
  ReusableStringStream::operator<<(pRVar3,&local_1a8);
  ReusableStringStream::str_abi_cxx11_(&local_1d8,(ReusableStringStream *)local_d0);
  StringRef::StringRef(&local_1b8,&local_1d8);
  XmlWriter::writeText(&this->xml,local_1b8,Newline);
  std::__cxx11::string::~string((string *)&local_1d8);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_d0);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;
                case ResultWas::ExplicitSkip:
                    elementName = "skipped";
                    break;
                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message"_sr, result.getExpression() );
            xml.writeAttribute( "type"_sr, result.getTestMacroName() );

            ReusableStringStream rss;
            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                rss << "SKIPPED\n";
            } else {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << TextFlow::Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            }

            if( result.hasMessage() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }